

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

void __thiscall OpenMD::FragmentStamp::checkConstraints(FragmentStamp *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  undefined8 uVar7;
  pointer ppVar8;
  reference pvVar9;
  OpenMDException *this_00;
  string *msg;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_bool> pVar10;
  ConstraintStamp *constraintStamp_2;
  size_t i_2;
  iterator iter;
  pair<int,_int> constraintPair;
  ConstraintStamp *constraintStamp_1;
  size_t i_1;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  allConstraints;
  ConstraintStamp *constraintStamp;
  size_t i;
  int natoms;
  ostringstream oss;
  undefined4 in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb4c;
  FragmentStamp *in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffb58;
  OpenMDException *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_fffffffffffffb70;
  string local_2d8 [32];
  ConstraintStamp *local_2b8;
  ulong local_2b0;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  undefined1 local_291;
  string local_270 [32];
  _Self local_250;
  _Self local_248;
  int local_240;
  int local_23c;
  pair<int,_int> local_238;
  ConstraintStamp *local_230;
  ulong local_228;
  undefined1 local_1e9;
  string local_1c8 [32];
  ConstraintStamp *local_1a8;
  ulong local_1a0;
  int local_184;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  sVar5 = getNAtoms((FragmentStamp *)0x35b1d9);
  local_184 = (int)sVar5;
  local_1a0 = 0;
  while( true ) {
    uVar1 = local_1a0;
    sVar5 = getNConstraints((FragmentStamp *)0x35b21b);
    if (sVar5 <= uVar1) {
      std::
      set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             *)0x35b597);
      local_228 = 0;
      while( true ) {
        uVar1 = local_228;
        sVar5 = getNConstraints((FragmentStamp *)0x35b5c0);
        if (sVar5 <= uVar1) {
          local_2b0 = 0;
          while( true ) {
            uVar1 = local_2b0;
            sVar5 = getNConstraints((FragmentStamp *)0x35b9af);
            if (sVar5 <= uVar1) {
              std::
              set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              ::~set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                      *)0x35bd07);
              std::__cxx11::ostringstream::~ostringstream(local_180);
              return;
            }
            local_2b8 = getConstraintStamp(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
            iVar3 = ConstraintStamp::getA(local_2b8);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),(long)iVar3);
            iVar3 = *pvVar9;
            iVar4 = ConstraintStamp::getB(local_2b8);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),(long)iVar4);
            if (iVar3 == *pvVar9) break;
            local_2b0 = local_2b0 + 1;
          }
          poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
          getName_abi_cxx11_((FragmentStamp *)
                             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          poVar6 = std::operator<<(poVar6,local_2d8);
          poVar6 = std::operator<<(poVar6,": ");
          poVar6 = std::operator<<(poVar6,"constraint(");
          iVar3 = ConstraintStamp::getA(local_2b8);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
          poVar6 = std::operator<<(poVar6,", ");
          iVar3 = ConstraintStamp::getB(local_2b8);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
          poVar6 = std::operator<<(poVar6,") belong to same rigidbody ");
          this_00 = (OpenMDException *)(in_RDI + 0x1c8);
          iVar3 = ConstraintStamp::getA(local_2b8);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)this_00,(long)iVar3);
          msg = (string *)std::ostream::operator<<(poVar6,*pvVar9);
          std::operator<<((ostream *)msg,"\n");
          std::__cxx11::string::~string(local_2d8);
          uVar7 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          OpenMDException::OpenMDException(this_00,msg);
          __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        local_230 = getConstraintStamp(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
        local_23c = ConstraintStamp::getA(local_230);
        local_240 = ConstraintStamp::getB(local_230);
        std::pair<int,_int>::pair<int,_int,_true>(&local_238,&local_23c,&local_240);
        if (local_238.second < local_238.first) {
          std::swap<int>(&local_238.first,&local_238.second);
        }
        local_248._M_node =
             (_Base_ptr)
             std::
             set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             ::find((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                     *)in_stack_fffffffffffffb58,(key_type *)in_stack_fffffffffffffb50);
        local_250._M_node =
             (_Base_ptr)
             std::
             set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        bVar2 = std::operator!=(&local_248,&local_250);
        if (bVar2) break;
        pVar10 = std::
                 set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 ::insert(in_stack_fffffffffffffb70,
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        local_2a8 = (_Base_ptr)pVar10.first._M_node;
        local_2a0 = pVar10.second;
        local_228 = local_228 + 1;
      }
      poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
      getName_abi_cxx11_((FragmentStamp *)
                         CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      poVar6 = std::operator<<(poVar6,local_270);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::operator<<(poVar6,"constraint(");
      ppVar8 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)in_stack_fffffffffffffb50
                         );
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar8->first);
      poVar6 = std::operator<<(poVar6,", ");
      ppVar8 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)in_stack_fffffffffffffb50
                         );
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar8->second);
      std::operator<<(poVar6,") appears multiple times\n");
      std::__cxx11::string::~string(local_270);
      local_291 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      OpenMDException::OpenMDException(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      local_291 = 0;
      __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_1a8 = getConstraintStamp(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    iVar3 = ConstraintStamp::getA(local_1a8);
    if (local_184 + -1 < iVar3) break;
    iVar3 = ConstraintStamp::getA(local_1a8);
    if (iVar3 < 0) break;
    iVar3 = ConstraintStamp::getB(local_1a8);
    if (local_184 + -1 < iVar3) break;
    iVar3 = ConstraintStamp::getB(local_1a8);
    if (iVar3 < 0) break;
    iVar3 = ConstraintStamp::getA(local_1a8);
    iVar4 = ConstraintStamp::getB(local_1a8);
    if (iVar3 == iVar4) break;
    local_1a0 = local_1a0 + 1;
  }
  poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
  getName_abi_cxx11_((FragmentStamp *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48))
  ;
  poVar6 = std::operator<<(poVar6,local_1c8);
  poVar6 = std::operator<<(poVar6,": constraint(");
  iVar3 = ConstraintStamp::getA(local_1a8);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
  poVar6 = std::operator<<(poVar6,", ");
  iVar3 = ConstraintStamp::getB(local_1a8);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
  std::operator<<(poVar6,") is invalid\n");
  std::__cxx11::string::~string(local_1c8);
  local_1e9 = 1;
  uVar7 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  local_1e9 = 0;
  __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void FragmentStamp::checkConstraints() {
    std::ostringstream oss;
    // make sure index is not out of range
    int natoms = getNAtoms();
    for (std::size_t i = 0; i < getNConstraints(); ++i) {
      ConstraintStamp* constraintStamp = getConstraintStamp(i);
      if (constraintStamp->getA() > natoms - 1 || constraintStamp->getA() < 0 ||
          constraintStamp->getB() > natoms - 1 || constraintStamp->getB() < 0 ||
          constraintStamp->getA() == constraintStamp->getB()) {
        oss << "Error in Fragment " << getName() << ": constraint("
            << constraintStamp->getA() << ", " << constraintStamp->getB()
            << ") is invalid\n";
        throw OpenMDException(oss.str());
      }
    }

    // make sure constraints are unique
    std::set<std::pair<int, int>> allConstraints;
    for (std::size_t i = 0; i < getNConstraints(); ++i) {
      ConstraintStamp* constraintStamp = getConstraintStamp(i);
      std::pair<int, int> constraintPair(constraintStamp->getA(),
                                         constraintStamp->getB());
      // make sure constraintPair.first is always less than or equal to
      // constraintPair.third
      if (constraintPair.first > constraintPair.second) {
        std::swap(constraintPair.first, constraintPair.second);
      }

      std::set<std::pair<int, int>>::iterator iter =
          allConstraints.find(constraintPair);
      if (iter != allConstraints.end()) {
        oss << "Error in Fragment " << getName() << ": "
            << "constraint(" << iter->first << ", " << iter->second
            << ") appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allConstraints.insert(constraintPair);
      }
    }

    // make sure atoms belong to same rigidbody are not constrained to
    // each other
    for (std::size_t i = 0; i < getNConstraints(); ++i) {
      ConstraintStamp* constraintStamp = getConstraintStamp(i);
      if (atom2Rigidbody[constraintStamp->getA()] ==
          atom2Rigidbody[constraintStamp->getB()]) {
        oss << "Error in Fragment " << getName() << ": "
            << "constraint(" << constraintStamp->getA() << ", "
            << constraintStamp->getB() << ") belong to same rigidbody "
            << atom2Rigidbody[constraintStamp->getA()] << "\n";
        throw OpenMDException(oss.str());
      }
    }
  }